

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

array_format_info * __thiscall
toml::basic_value<toml::type_config>::as_array_fmt(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == array) {
    return (array_format_info *)((long)&this->field_1 + 8);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_array_fmt()","");
  throw_bad_cast(this,&local_38,array);
}

Assistant:

array_format_info const& as_array_fmt() const
    {
        if(this->type_ != value_t::array)
        {
            this->throw_bad_cast("toml::value::as_array_fmt()", value_t::array);
        }
        return this->array_.format;
    }